

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall
optional_scalars::ScalarStuff::UnPackTo
          (ScalarStuff *this,ScalarStuffT *_o,resolver_function_t *_resolver)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  unsigned_short vtsize;
  ushort uVar5;
  int16_t iVar6;
  uint16_t uVar7;
  uint uVar8;
  int32_t iVar9;
  uint32_t uVar10;
  ulong uVar11;
  ScalarStuff SVar12;
  ulong uVar13;
  _Storage<long,_true> _Var14;
  _Storage<unsigned_long,_true> _Var15;
  int64_t iVar16;
  uint64_t uVar17;
  bool bVar18;
  float fVar19;
  _Storage<double,_true> _Var20;
  double dVar21;
  
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 5) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 4);
  }
  if (uVar5 == 0) {
    SVar12.super_Table = (Table)0x0;
  }
  else {
    SVar12.super_Table = this[uVar5].super_Table;
  }
  _o->just_i8 = (int8_t)SVar12.super_Table;
  if (uVar1 < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 6);
  }
  if (uVar1 == 0) {
    uVar1 = 0;
    uVar5 = 0;
  }
  else {
    uVar1 = (ushort)(byte)this[uVar1].super_Table;
    uVar5 = 0x100;
  }
  (_o->maybe_i8).super__Optional_base<signed_char,_true,_true>._M_payload.
  super__Optional_payload_base<signed_char> = (_Optional_payload_base<signed_char>)(uVar5 | uVar1);
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 9) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 8);
  }
  if (uVar5 == 0) {
    SVar12.super_Table = (Table)0x2a;
  }
  else {
    SVar12.super_Table = this[uVar5].super_Table;
  }
  _o->default_i8 = (int8_t)SVar12.super_Table;
  if (uVar1 < 0xb) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 10);
  }
  if (uVar5 == 0) {
    SVar12.super_Table = (Table)0x0;
  }
  else {
    SVar12.super_Table = this[uVar5].super_Table;
  }
  _o->just_u8 = (uint8_t)SVar12.super_Table;
  if (uVar1 < 0xd) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0xc);
  }
  if (uVar1 == 0) {
    uVar1 = 0;
    uVar5 = 0;
  }
  else {
    uVar1 = (ushort)(byte)this[uVar1].super_Table;
    uVar5 = 0x100;
  }
  (_o->maybe_u8).super__Optional_base<unsigned_char,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_char> =
       (_Optional_payload_base<unsigned_char>)(uVar5 | uVar1);
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0xf) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0xe);
  }
  if (uVar5 == 0) {
    SVar12.super_Table = (Table)0x2a;
  }
  else {
    SVar12.super_Table = this[uVar5].super_Table;
  }
  _o->default_u8 = (uint8_t)SVar12.super_Table;
  if (uVar1 < 0x11) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x10);
  }
  if (uVar1 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int16_t *)(this + uVar1);
  }
  _o->just_i16 = iVar6;
  uVar8 = 0;
  uVar1 = 0;
  if (0x12 < *(ushort *)(this + lVar3)) {
    uVar1 = *(ushort *)(this + lVar3 + 0x12);
  }
  uVar2 = 0;
  if (uVar1 != 0) {
    uVar8 = (uint)*(ushort *)(this + uVar1);
    uVar2 = 0x10000;
  }
  (_o->maybe_i16).super__Optional_base<short,_true,_true>._M_payload.
  super__Optional_payload_base<short> = (_Optional_payload_base<short>)(uVar8 | uVar2);
  lVar3 = -(long)*(int *)this;
  if (*(ushort *)(this + -(long)*(int *)this) < 0x15) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x14);
  }
  if (uVar1 == 0) {
    iVar6 = 0x2a;
  }
  else {
    iVar6 = *(int16_t *)(this + uVar1);
  }
  _o->default_i16 = iVar6;
  if (*(ushort *)(this + lVar3) < 0x17) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x16);
  }
  if (uVar1 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(uint16_t *)(this + uVar1);
  }
  _o->just_u16 = uVar7;
  uVar8 = 0;
  uVar1 = 0;
  if (0x18 < *(ushort *)(this + lVar3)) {
    uVar1 = *(ushort *)(this + lVar3 + 0x18);
  }
  uVar2 = 0;
  if (uVar1 != 0) {
    uVar8 = (uint)*(ushort *)(this + uVar1);
    uVar2 = 0x10000;
  }
  (_o->maybe_u16).super__Optional_base<unsigned_short,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_short> =
       (_Optional_payload_base<unsigned_short>)(uVar8 | uVar2);
  lVar3 = -(long)*(int *)this;
  if (*(ushort *)(this + -(long)*(int *)this) < 0x1b) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x1a);
  }
  if (uVar1 == 0) {
    uVar7 = 0x2a;
  }
  else {
    uVar7 = *(uint16_t *)(this + uVar1);
  }
  _o->default_u16 = uVar7;
  iVar9 = 0;
  uVar1 = 0;
  if (0x1c < *(ushort *)(this + lVar3)) {
    uVar1 = *(ushort *)(this + lVar3 + 0x1c);
  }
  if (uVar1 != 0) {
    iVar9 = *(int32_t *)(this + uVar1);
  }
  _o->just_i32 = iVar9;
  if (*(ushort *)(this + -(long)*(int *)this) < 0x1f) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + (0x1e - (long)*(int *)this));
  }
  uVar4 = 0x100000000;
  if (uVar1 == 0) {
    uVar11 = 0;
    uVar13 = 0;
  }
  else {
    uVar11 = (ulong)*(uint *)(this + uVar1);
    uVar13 = 0x100000000;
  }
  (_o->maybe_i32).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       = (_Optional_payload_base<int>)(uVar11 | uVar13);
  if (*(ushort *)(this + -(long)*(int *)this) < 0x21) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + (0x20 - (long)*(int *)this));
  }
  if (uVar1 == 0) {
    iVar9 = 0x2a;
  }
  else {
    iVar9 = *(int32_t *)(this + uVar1);
  }
  _o->default_i32 = iVar9;
  uVar10 = 0;
  uVar1 = 0;
  if (0x22 < *(ushort *)(this + -(long)*(int *)this)) {
    uVar1 = *(ushort *)(this + (0x22 - (long)*(int *)this));
  }
  if (uVar1 != 0) {
    uVar10 = *(uint32_t *)(this + uVar1);
  }
  _o->just_u32 = uVar10;
  if (*(ushort *)(this + -(long)*(int *)this) < 0x25) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + (0x24 - (long)*(int *)this));
  }
  if (uVar1 == 0) {
    uVar11 = 0;
    uVar13 = 0;
  }
  else {
    uVar11 = (ulong)*(uint *)(this + uVar1);
    uVar13 = 0x100000000;
  }
  (_o->maybe_u32).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)(uVar11 | uVar13);
  if (*(ushort *)(this + -(long)*(int *)this) < 0x27) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + (0x26 - (long)*(int *)this));
  }
  if (uVar1 == 0) {
    uVar10 = 0x2a;
  }
  else {
    uVar10 = *(uint32_t *)(this + uVar1);
  }
  _o->default_u32 = uVar10;
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  _Var14._M_value._2_6_ = 0;
  _Var14._M_value._0_2_ = uVar1;
  if (uVar1 < 0x29) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x28);
  }
  if (uVar5 == 0) {
    iVar16 = 0;
  }
  else {
    iVar16 = *(int64_t *)(this + uVar5);
  }
  _o->just_i64 = iVar16;
  if (uVar1 < 0x2b) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x2a);
  }
  if (uVar1 != 0) {
    _Var14 = *(_Storage<long,_true> *)(this + uVar1);
  }
  (_o->maybe_i64).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload = _Var14;
  (_o->maybe_i64).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = uVar1 != 0;
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  _Var15._M_value._2_6_ = 0;
  _Var15._M_value._0_2_ = uVar1;
  if (uVar1 < 0x2d) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x2c);
  }
  if (uVar5 == 0) {
    iVar16 = 0x2a;
  }
  else {
    iVar16 = *(int64_t *)(this + uVar5);
  }
  _o->default_i64 = iVar16;
  if (uVar1 < 0x2f) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x2e);
  }
  if (uVar5 == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = *(uint64_t *)(this + uVar5);
  }
  _o->just_u64 = uVar17;
  if (uVar1 < 0x31) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x30);
  }
  if (uVar1 != 0) {
    _Var15 = *(_Storage<unsigned_long,_true> *)(this + uVar1);
  }
  (_o->maybe_u64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = _Var15;
  (_o->maybe_u64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = uVar1 != 0;
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x33) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x32);
  }
  if (uVar5 == 0) {
    uVar17 = 0x2a;
  }
  else {
    uVar17 = *(uint64_t *)(this + uVar5);
  }
  _o->default_u64 = uVar17;
  if (uVar1 < 0x35) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x34);
  }
  if (uVar5 == 0) {
    fVar19 = 0.0;
  }
  else {
    fVar19 = *(float *)(this + uVar5);
  }
  _o->just_f32 = fVar19;
  if (uVar1 < 0x37) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x36);
  }
  if (uVar1 == 0) {
    uVar11 = 0;
    uVar4 = 0;
  }
  else {
    uVar11 = (ulong)*(uint *)(this + uVar1);
  }
  (_o->maybe_f32).super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float> = (_Optional_payload_base<float>)(uVar11 | uVar4);
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x39) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(ushort *)(this + lVar3 + 0x38);
  }
  if ((short)uVar4 == 0) {
    fVar19 = 42.0;
  }
  else {
    fVar19 = *(float *)(this + uVar4);
  }
  _o->default_f32 = fVar19;
  if (uVar1 < 0x3b) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(ushort *)(this + lVar3 + 0x3a);
  }
  if ((short)uVar4 == 0) {
    _Var20._M_value = 0.0;
  }
  else {
    _Var20 = *(_Storage<double,_true> *)(this + uVar4);
  }
  _o->just_f64 = (double)_Var20;
  if (uVar1 < 0x3d) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x3c);
  }
  if (uVar1 != 0) {
    _Var20 = *(_Storage<double,_true> *)(this + uVar1);
  }
  (_o->maybe_f64).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload = _Var20;
  (_o->maybe_f64).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = uVar1 != 0;
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x3f) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(ushort *)(this + lVar3 + 0x3e);
  }
  if ((short)uVar4 == 0) {
    dVar21 = 42.0;
  }
  else {
    dVar21 = *(double *)(this + uVar4);
  }
  _o->default_f64 = dVar21;
  if (uVar1 < 0x41) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x40);
  }
  if (uVar5 == 0) {
    bVar18 = false;
  }
  else {
    bVar18 = this[uVar5].super_Table != (Table)0x0;
  }
  _o->just_bool = bVar18;
  if (uVar1 < 0x43) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x42);
  }
  if (uVar1 == 0) {
    uVar1 = 0;
    uVar5 = 0;
  }
  else {
    uVar1 = (ushort)(this[uVar1].super_Table != (Table)0x0);
    uVar5 = 0x100;
  }
  (_o->maybe_bool).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(uVar5 | uVar1);
  lVar3 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 0x45) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(ushort *)(this + lVar3 + 0x44);
  }
  if ((short)uVar4 == 0) {
    bVar18 = true;
  }
  else {
    bVar18 = this[uVar4].super_Table != (Table)0x0;
  }
  _o->default_bool = bVar18;
  if (uVar1 < 0x47) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar3 + 0x46);
  }
  if (uVar5 == 0) {
    SVar12.super_Table = (Table)0x0;
  }
  else {
    SVar12.super_Table = this[uVar5].super_Table;
  }
  _o->just_enum = (OptionalByte)SVar12.super_Table;
  if (uVar1 < 0x49) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar3 + 0x48);
  }
  if (uVar1 == 0) {
    uVar1 = 0;
    uVar5 = 0;
  }
  else {
    uVar1 = (ushort)(byte)this[uVar1].super_Table;
    uVar5 = 0x100;
  }
  (_o->maybe_enum).super__Optional_base<optional_scalars::OptionalByte,_true,_true>._M_payload.
  super__Optional_payload_base<optional_scalars::OptionalByte> =
       (_Optional_payload_base<optional_scalars::OptionalByte>)(uVar5 | uVar1);
  if (*(ushort *)(this + -(long)*(int *)this) < 0x4b) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + (0x4a - (long)*(int *)this));
  }
  if (uVar1 == 0) {
    SVar12.super_Table = (Table)0x1;
  }
  else {
    SVar12.super_Table = this[uVar1].super_Table;
  }
  _o->default_enum = (OptionalByte)SVar12.super_Table;
  return;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}